

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::FunctionBody::AllocateInlineCache(FunctionBody *this)

{
  Type *addr;
  ThreadContext *this_00;
  code *pcVar1;
  undefined8 size;
  bool bVar2;
  uint32 uVar3;
  uint32 uVar4;
  uint uVar5;
  BOOL BVar6;
  PropertyId PVar7;
  undefined4 *puVar8;
  Recycler *pRVar9;
  void **ppvVar10;
  uchar *puVar11;
  void *pvVar12;
  RootObjectBase *this_01;
  PropertyRecord *pPVar13;
  InlineCache *pIVar14;
  long lVar15;
  Type *addr_00;
  uint uVar16;
  ulong uVar17;
  undefined1 local_98 [8];
  TrackAllocData data;
  
  if ((this->inlineCaches).ptr != (void **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1883,"(this->inlineCaches == nullptr)",
                                "this->inlineCaches == nullptr");
    if (!bVar2) goto LAB_007783d7;
    *puVar8 = 0;
  }
  uVar3 = GetCountField(this,InlineCacheCount);
  uVar4 = GetCountField(this,IsInstInlineCacheCount);
  uVar5 = uVar4 + uVar3;
  if (uVar5 != 0) {
    uVar17 = (ulong)uVar5;
    local_98 = (undefined1  [8])&void*::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_2ab601b;
    data.filename._0_4_ = 0x188b;
    data.plusSize = uVar17;
    pRVar9 = Memory::Recycler::TrackAllocInfo
                       (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                        recycler,(TrackAllocData *)local_98);
    BVar6 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_007783d7;
      *puVar8 = 0;
    }
    ppvVar10 = (void **)Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                                  (pRVar9,uVar17 * 8);
    if (ppvVar10 == (void **)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) goto LAB_007783d7;
      *puVar8 = 0;
    }
    local_98 = (undefined1  [8])&unsigned_char::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_2ab601b;
    data.filename._0_4_ = 0x188e;
    data.plusSize = uVar17;
    pRVar9 = Memory::Recycler::TrackAllocInfo
                       (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                        recycler,(TrackAllocData *)local_98);
    BVar6 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_007783d7;
      *puVar8 = 0;
    }
    puVar11 = (uchar *)Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>
                                 (pRVar9,uVar17);
    if (puVar11 == (uchar *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) goto LAB_007783d7;
      *puVar8 = 0;
    }
    addr = &this->m_inlineCacheTypes;
    data._32_8_ = uVar17;
    Memory::Recycler::WBSetBit((char *)addr);
    (this->m_inlineCacheTypes).ptr = puVar11;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    uVar4 = GetCountField(this,RootObjectLoadInlineCacheStart);
    if (uVar4 == 0) {
      uVar17 = 0;
    }
    else {
      uVar17 = 0;
      do {
        pvVar12 = new<Memory::InlineCacheAllocator>
                            (0x20,&((this->super_ParseableFunctionInfo).super_FunctionProxy.
                                   m_scriptContext)->inlineCacheAllocator,0x782450);
        ppvVar10[uVar17] = pvVar12;
        uVar17 = uVar17 + 1;
      } while (uVar4 != uVar17);
    }
    this_01 = GetRootObject(this);
    this_00 = ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
              threadContext;
    uVar4 = GetCountField(this,RootObjectLoadMethodInlineCacheStart);
    uVar16 = (uint)uVar17;
    if (uVar16 < uVar4) {
      lVar15 = 0;
      do {
        PVar7 = GetPropertyIdFromCacheId(this,uVar16 + (int)lVar15);
        pPVar13 = ThreadContext::GetPropertyName(this_00,PVar7);
        pIVar14 = RootObjectBase::GetInlineCache(this_01,pPVar13,false,false);
        ppvVar10[(uVar17 & 0xffffffff) + lVar15] = pIVar14;
        lVar15 = lVar15 + 1;
      } while (((uVar17 & 0xffffffff) - (ulong)uVar4) + lVar15 != 0);
      uVar17 = (ulong)(uVar16 + (int)lVar15);
    }
    uVar4 = GetCountField(this,RootObjectStoreInlineCacheStart);
    uVar16 = (uint)uVar17;
    if (uVar16 < uVar4) {
      lVar15 = 0;
      do {
        PVar7 = GetPropertyIdFromCacheId(this,uVar16 + (int)lVar15);
        pPVar13 = ThreadContext::GetPropertyName(this_00,PVar7);
        pIVar14 = RootObjectBase::GetInlineCache(this_01,pPVar13,true,false);
        ppvVar10[(uVar17 & 0xffffffff) + lVar15] = pIVar14;
        lVar15 = lVar15 + 1;
      } while (((uVar17 & 0xffffffff) - (ulong)uVar4) + lVar15 != 0);
      uVar17 = (ulong)(uVar16 + (int)lVar15);
    }
    uVar16 = (uint)uVar17;
    if (uVar16 < uVar3) {
      lVar15 = 0;
      do {
        PVar7 = GetPropertyIdFromCacheId(this,uVar16 + (int)lVar15);
        pPVar13 = ThreadContext::GetPropertyName(this_00,PVar7);
        pIVar14 = RootObjectBase::GetInlineCache(this_01,pPVar13,false,true);
        ppvVar10[(uVar17 & 0xffffffff) + lVar15] = pIVar14;
        lVar15 = lVar15 + 1;
      } while (((uVar17 & 0xffffffff) - (ulong)uVar3) + lVar15 != 0);
      uVar16 = uVar16 + (int)lVar15;
    }
    if (uVar16 < uVar5) {
      lVar15 = 0;
      do {
        pvVar12 = new<Memory::CacheAllocator>
                            (0x20,&((this->super_ParseableFunctionInfo).super_FunctionProxy.
                                   m_scriptContext)->isInstInlineCacheAllocator,0x78235a);
        ppvVar10[(ulong)uVar16 + lVar15] = pvVar12;
        lVar15 = lVar15 + 1;
      } while (uVar5 - uVar16 != (int)lVar15);
    }
    size = data._32_8_;
    local_98 = (undefined1  [8])&unsigned_char::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = data._32_8_;
    data.count = (size_t)anon_var_dwarf_2ab601b;
    data.filename._0_4_ = 0x18b7;
    pRVar9 = Memory::Recycler::TrackAllocInfo
                       (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                        recycler,(TrackAllocData *)local_98);
    BVar6 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_007783d7;
      *puVar8 = 0;
    }
    puVar11 = (uchar *)Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>
                                 (pRVar9,size);
    if (puVar11 == (uchar *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_007783d7:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar8 = 0;
    }
    addr_00 = &this->inlineCaches;
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = puVar11;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    Memory::Recycler::WBSetBit((char *)addr_00);
    addr_00->ptr = ppvVar10;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
  }
  return;
}

Assistant:

void FunctionBody::AllocateInlineCache()
    {
        Assert(this->inlineCaches == nullptr);
        uint isInstInlineCacheStart = this->GetInlineCacheCount();
        uint totalCacheCount = isInstInlineCacheStart + GetIsInstInlineCacheCount();

        if (totalCacheCount != 0)
        {
            // Root object inline cache are not leaf
            void ** inlineCaches = RecyclerNewArrayZ(this->m_scriptContext->GetRecycler(),
                void*, totalCacheCount);
#if DBG
            this->m_inlineCacheTypes = RecyclerNewArrayLeafZ(this->m_scriptContext->GetRecycler(),
                byte, totalCacheCount);
#endif
            uint i = 0;
            uint plainInlineCacheEnd = GetRootObjectLoadInlineCacheStart();
            __analysis_assume(plainInlineCacheEnd <= totalCacheCount);
            for (; i < plainInlineCacheEnd; i++)
            {
                inlineCaches[i] = AllocatorNewZ(InlineCacheAllocator,
                    this->m_scriptContext->GetInlineCacheAllocator(), InlineCache);
            }
            Js::RootObjectBase * rootObject = this->GetRootObject();
            ThreadContext * threadContext = this->GetScriptContext()->GetThreadContext();
            uint rootObjectLoadInlineCacheEnd = GetRootObjectLoadMethodInlineCacheStart();
            __analysis_assume(rootObjectLoadInlineCacheEnd <= totalCacheCount);
            for (; i < rootObjectLoadInlineCacheEnd; i++)
            {
                inlineCaches[i] = rootObject->GetInlineCache(
                    threadContext->GetPropertyName(this->GetPropertyIdFromCacheId(i)), false, false);
            }
            uint rootObjectLoadMethodInlineCacheEnd = GetRootObjectStoreInlineCacheStart();
            __analysis_assume(rootObjectLoadMethodInlineCacheEnd <= totalCacheCount);
            for (; i < rootObjectLoadMethodInlineCacheEnd; i++)
            {
                inlineCaches[i] = rootObject->GetInlineCache(
                    threadContext->GetPropertyName(this->GetPropertyIdFromCacheId(i)), true, false);
            }
            uint rootObjectStoreInlineCacheEnd = isInstInlineCacheStart;
            __analysis_assume(rootObjectStoreInlineCacheEnd <= totalCacheCount);
            for (; i < rootObjectStoreInlineCacheEnd; i++)
            {
#pragma prefast(suppress:6386, "The analysis assume didn't help prefast figure out this is in range")
                inlineCaches[i] = rootObject->GetInlineCache(
                    threadContext->GetPropertyName(this->GetPropertyIdFromCacheId(i)), false, true);
            }
            for (; i < totalCacheCount; i++)
            {
                inlineCaches[i] = AllocatorNewStructZ(CacheAllocator,
                    this->m_scriptContext->GetIsInstInlineCacheAllocator(), IsInstInlineCache);
            }
#if DBG
            this->m_inlineCacheTypes = RecyclerNewArrayLeafZ(this->m_scriptContext->GetRecycler(),
                byte, totalCacheCount);
#endif
            this->inlineCaches = inlineCaches;
        }
    }